

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O2

unique_ptr<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
__thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
          *node)

{
  long lVar1;
  long *plVar2;
  _Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  *p_Var3;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  _Var4;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  _Var5;
  long *in_RDX;
  long lVar6;
  __index_type *this_00;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_70;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_68 [2];
  long *local_58;
  long *local_50;
  _Head_base<0UL,_verilogAST::ModuleInstantiation_*,_false> local_48;
  _Variant_storage<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_40;
  
  lVar1 = (*(long **)(*in_RDX + 0x60))[1];
  local_48._M_head_impl = (ModuleInstantiation *)this;
  for (lVar6 = **(long **)(*in_RDX + 0x60); lVar6 != lVar1; lVar6 = lVar6 + 0x28) {
    local_58 = *(long **)(lVar6 + 0x20);
    *(undefined8 *)(lVar6 + 0x20) = 0;
    (**(code **)(node->_M_t).
                super___uniq_ptr_impl<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::ModuleInstantiation_*,_std::default_delete<verilogAST::ModuleInstantiation>_>
                .super__Head_base<0UL,_verilogAST::ModuleInstantiation_*,_false>._M_head_impl)
              (local_68,node,&local_58);
    _Var4 = local_68[0];
    local_68[0] = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                   )0x0;
    plVar2 = *(long **)(lVar6 + 0x20);
    *(_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
      *)(lVar6 + 0x20) = _Var4;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x10))();
      if (local_68[0] !=
          (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
           )0x0) {
        (**(code **)(*(long *)local_68[0] + 0x10))();
      }
    }
    local_68[0] = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                   )0x0;
    if (local_58 != (long *)0x0) {
      (**(code **)(*local_58 + 0x10))();
    }
    local_58 = (long *)0x0;
  }
  p_Var3 = *(_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
             **)(*in_RDX + 0x30);
  local_50 = in_RDX;
  for (this_00 = *(__index_type **)(*in_RDX + 0x28);
      (_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
       *)this_00 != p_Var3; this_00 = this_00 + 0x18) {
    std::__detail::__variant::
    _Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                       *)&local_40,
                      (_Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                       *)this_00);
    (*(code *)(node->_M_t).
              super___uniq_ptr_impl<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
              ._M_t.
              super__Tuple_impl<0UL,_verilogAST::ModuleInstantiation_*,_std::default_delete<verilogAST::ModuleInstantiation>_>
              .super__Head_base<0UL,_verilogAST::ModuleInstantiation_*,_false>._M_head_impl[1].
              module_name.field_2._M_allocated_capacity)(local_68,node,&local_40);
    std::__detail::__variant::
    _Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::operator=((_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                 *)this_00,
                (_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                 *)&local_68[0]._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::~_Variant_storage((_Variant_storage<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                         *)&local_68[0]._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::~_Variant_storage(&local_40);
    local_70 = (((_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)(this_00 + 0x10))->
               super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
               ).
               super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
               .
               super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
               .
               super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
               ._M_u;
    (((_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
       *)(this_00 + 0x10))->
    super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
    ).
    super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
    .
    super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
    .
    super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
    ._M_u = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
             )0x0;
    (**(code **)(node->_M_t).
                super___uniq_ptr_impl<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>_>
                ._M_t.
                super__Tuple_impl<0UL,_verilogAST::ModuleInstantiation_*,_std::default_delete<verilogAST::ModuleInstantiation>_>
                .super__Head_base<0UL,_verilogAST::ModuleInstantiation_*,_false>._M_head_impl)
              (local_68,node,&local_70);
    _Var5 = local_68[0];
    local_68[0] = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                   )0x0;
    _Var4 = (((_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
               *)(this_00 + 0x10))->
            super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
            ).
            super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
            .
            super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
            .
            super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
            ._M_u;
    *(_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
      *)(this_00 + 0x10) = _Var5;
    if (_Var4 != (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  )0x0) {
      (**(code **)(*(long *)_Var4 + 0x10))();
      if (local_68[0] !=
          (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
           )0x0) {
        (**(code **)(*(long *)local_68[0] + 0x10))();
      }
    }
    local_68[0] = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                   )0x0;
    if (local_70 !=
        (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
         )0x0) {
      (**(code **)(*(long *)local_70 + 0x10))();
    }
    local_70 = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                )0x0;
  }
  *(long *)local_48._M_head_impl = *local_50;
  *local_50 = 0;
  return (__uniq_ptr_data<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>,_true,_true>
          )(__uniq_ptr_data<verilogAST::ModuleInstantiation,_std::default_delete<verilogAST::ModuleInstantiation>,_true,_true>
            )local_48._M_head_impl;
}

Assistant:

std::unique_ptr<ModuleInstantiation> Transformer::visit(
    std::unique_ptr<ModuleInstantiation> node) {
  for (auto&& conn : *node->connections) {
    conn.second = this->visit(std::move(conn.second));
  }
  for (auto&& param : node->parameters) {
    param.first = this->visit(std::move(param.first));
    param.second = this->visit(std::move(param.second));
  }
  return node;
}